

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

void __thiscall
FStateDefinitions::ResolveGotoLabels
          (FStateDefinitions *this,PClassActor *actor,AActor *defaults,
          TArray<FStateDefine,_FStateDefine> *list)

{
  char *name;
  FState *pFVar1;
  FStateDefine *pFVar2;
  uint i;
  ulong uVar3;
  AActor *actor_00;
  long lVar4;
  
  lVar4 = 0x20;
  actor_00 = (AActor *)actor;
  for (uVar3 = 0; uVar3 < list->Count; uVar3 = uVar3 + 1) {
    pFVar2 = list->Array;
    name = *(char **)((long)pFVar2 + lVar4 + -8);
    if ((name != (char *)0x0) && (*(char *)((long)&(pFVar2->Label).Index + lVar4) == '\x04')) {
      pFVar1 = ResolveGotoLabel(this,actor_00,actor,name);
      pFVar2 = list->Array;
      *(FState **)((long)pFVar2 + lVar4 + -8) = pFVar1;
      *(undefined1 *)((long)&(pFVar2->Label).Index + lVar4) = 1;
    }
    if (*(int *)((long)pFVar2 + lVar4 + -0xc) != 0) {
      actor_00 = (AActor *)actor;
      ResolveGotoLabels(this,actor,defaults,
                        (TArray<FStateDefine,_FStateDefine> *)((long)pFVar2 + lVar4 + -0x18));
    }
    lVar4 = lVar4 + 0x28;
  }
  return;
}

Assistant:

void FStateDefinitions::ResolveGotoLabels (PClassActor *actor, AActor *defaults, TArray<FStateDefine> & list)
{
	for (unsigned i = 0; i < list.Size(); i++)
	{
		if (list[i].State != NULL && list[i].DefineFlags == SDF_LABEL)
		{ // It's not a valid state, so it must be a label string. Resolve it.
			list[i].State = ResolveGotoLabel (defaults, actor, (char *)list[i].State);
			list[i].DefineFlags = SDF_STATE;
		}
		if (list[i].Children.Size() > 0) ResolveGotoLabels(actor, defaults, list[i].Children);
	}
}